

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O2

void fe_dct3(fe_t *fe,mfcc_t *mfcep,powspec_t *mflogspec)

{
  byte bVar1;
  int iVar2;
  melfb_t *pmVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  
  pmVar3 = fe->mel_fb;
  iVar2 = pmVar3->num_filters;
  for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
    dVar6 = (double)(float)*mfcep * 0.707106781186548;
    bVar1 = fe->num_cepstra;
    for (uVar5 = 1; uVar5 < bVar1; uVar5 = uVar5 + 1) {
      dVar6 = dVar6 + (double)((float)mfcep[uVar5] * (float)pmVar3->mel_cosine[uVar5][lVar4]);
      mflogspec[lVar4] = (powspec_t)dVar6;
    }
    mflogspec[lVar4] = (powspec_t)(dVar6 * (double)(float)pmVar3->sqrt_inv_2n);
  }
  return;
}

Assistant:

void
fe_dct3(fe_t * fe, const mfcc_t * mfcep, powspec_t * mflogspec)
{
    int32 i, j;

    for (i = 0; i < fe->mel_fb->num_filters; ++i) {
        mflogspec[i] = COSMUL(mfcep[0], SQRT_HALF);
        for (j = 1; j < fe->num_cepstra; j++) {
            mflogspec[i] += COSMUL(mfcep[j], fe->mel_fb->mel_cosine[j][i]);
        }
        mflogspec[i] = COSMUL(mflogspec[i], fe->mel_fb->sqrt_inv_2n);
    }
}